

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bassigngets(bstring b,bNgetc getcPtr,void *parm,char terminator)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  
  uVar2 = 0xffffffff;
  uVar4 = 0xffffffff;
  if ((((b != (bstring)0x0) && (uVar1 = b->mlen, uVar4 = uVar2, 0 < (int)uVar1)) &&
      (getcPtr != (bNgetc)0x0)) && ((uint)b->slen <= uVar1)) {
    iVar7 = uVar1 - 2;
    lVar6 = 0;
    do {
      iVar3 = (*getcPtr)(parm);
      if (iVar3 < 0) {
        bVar5 = 1;
        goto LAB_001158ae;
      }
      if (iVar7 < lVar6) {
        b->slen = (int)lVar6;
        iVar7 = balloc(b,(int)lVar6 + 2);
        if (iVar7 != 0) {
          return -1;
        }
        iVar7 = b->mlen + -2;
      }
      b->data[lVar6] = (uchar)iVar3;
      lVar6 = lVar6 + 1;
    } while (iVar3 != terminator);
    bVar5 = (byte)terminator >> 7;
LAB_001158ae:
    iVar7 = (int)lVar6;
    b->data[iVar7] = '\0';
    b->slen = iVar7;
    uVar4 = (uint)(iVar7 == 0 & bVar5);
  }
  return uVar4;
}

Assistant:

int bassigngets (bstring b, bNgetc getcPtr, void * parm, char terminator) {
int c, d, e;

	if (b == NULL || b->mlen <= 0 || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || getcPtr == NULL) return BSTR_ERR;
	d = 0;
	e = b->mlen - 2;

	while ((c = getcPtr (parm)) >= 0) {
		if (d > e) {
			b->slen = d;
			if (balloc (b, d + 2) != BSTR_OK) return BSTR_ERR;
			e = b->mlen - 2;
		}
		b->data[d] = (unsigned char) c;
		d++;
		if (c == terminator) break;
	}

	b->data[d] = (unsigned char) '\0';
	b->slen = d;

	return d == 0 && c < 0;
}